

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

ArgumentMismatch * CLI::ArgumentMismatch::AtMost(string *name,int num,size_t received)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  char *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  string *in_stack_ffffffffffffff68;
  ArgumentMismatch *in_stack_ffffffffffffff70;
  
  __lhs = in_RDI;
  ::std::operator+(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  std::__cxx11::to_string(in_stack_ffffffffffffff3c);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                   in_stack_ffffffffffffff30);
  ::std::operator+(__lhs,(char *)in_RDI);
  std::__cxx11::to_string(CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                   in_stack_ffffffffffffff30);
  ArgumentMismatch(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  ::std::__cxx11::string::~string(in_RDI);
  ::std::__cxx11::string::~string(in_RDI);
  ::std::__cxx11::string::~string(in_RDI);
  ::std::__cxx11::string::~string(in_RDI);
  ::std::__cxx11::string::~string(in_RDI);
  ::std::__cxx11::string::~string(in_RDI);
  return (ArgumentMismatch *)__lhs;
}

Assistant:

static ArgumentMismatch AtMost(std::string name, int num, std::size_t received) {
        return ArgumentMismatch(name + ": At Most " + std::to_string(num) + " required but received " +
                                std::to_string(received));
    }